

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void I422ToUYVYRow_SSE2(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uyvy,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint8_t uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  int iVar26;
  undefined1 uVar35;
  uint8_t uVar36;
  uint8_t uVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  undefined1 auVar27 [16];
  undefined1 auVar40 [16];
  int width_local;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint8_t uVar48;
  uint8_t uVar49;
  uint8_t uVar50;
  uint8_t uVar51;
  
  lVar25 = (long)src_v - (long)src_u;
  do {
    uVar1 = *(ulong *)src_u;
    uVar2 = *(undefined8 *)((long)src_u + lVar25);
    src_u = (uint8_t *)((long)src_u + 8);
    uVar39 = (uint8_t)((ulong)uVar2 >> 0x38);
    uVar51 = (uint8_t)(uVar1 >> 0x38);
    auVar47._8_6_ = 0;
    auVar47._0_8_ = uVar1;
    auVar47[0xe] = uVar51;
    auVar47[0xf] = uVar39;
    uVar38 = (uint8_t)((ulong)uVar2 >> 0x30);
    auVar46._14_2_ = auVar47._14_2_;
    auVar46._8_5_ = 0;
    auVar46._0_8_ = uVar1;
    auVar46[0xd] = uVar38;
    uVar50 = (uint8_t)(uVar1 >> 0x30);
    auVar45._13_3_ = auVar46._13_3_;
    auVar45._8_4_ = 0;
    auVar45._0_8_ = uVar1;
    auVar45[0xc] = uVar50;
    uVar37 = (uint8_t)((ulong)uVar2 >> 0x28);
    auVar44._12_4_ = auVar45._12_4_;
    auVar44._8_3_ = 0;
    auVar44._0_8_ = uVar1;
    auVar44[0xb] = uVar37;
    uVar49 = (uint8_t)(uVar1 >> 0x28);
    auVar43._11_5_ = auVar44._11_5_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = uVar1;
    auVar43[10] = uVar49;
    uVar36 = (uint8_t)((ulong)uVar2 >> 0x20);
    auVar42._10_6_ = auVar43._10_6_;
    auVar42[8] = 0;
    auVar42._0_8_ = uVar1;
    auVar42[9] = uVar36;
    uVar48 = (uint8_t)(uVar1 >> 0x20);
    auVar41._9_7_ = auVar42._9_7_;
    auVar41[8] = uVar48;
    auVar41._0_8_ = uVar1;
    uVar35 = (undefined1)((ulong)uVar2 >> 0x18);
    auVar24._1_8_ = auVar41._8_8_;
    auVar24[0] = uVar35;
    auVar24._9_7_ = 0;
    auVar23._10_6_ = 0;
    auVar23._0_10_ = SUB1610(auVar24 << 0x38,6);
    auVar22._11_5_ = 0;
    auVar22._0_11_ = SUB1611(auVar23 << 0x30,5);
    auVar21._12_4_ = 0;
    auVar21._0_12_ = SUB1612(auVar22 << 0x28,4);
    auVar20._13_3_ = 0;
    auVar20._0_13_ = SUB1613(auVar21 << 0x20,3);
    auVar40._14_2_ = 0;
    auVar40._0_14_ = SUB1614(auVar20 << 0x18,2);
    auVar40 = auVar40 << 0x10;
    uVar4 = *src_y;
    puVar5 = src_y + 1;
    puVar6 = src_y + 2;
    puVar7 = src_y + 3;
    puVar8 = src_y + 4;
    puVar9 = src_y + 5;
    puVar10 = src_y + 6;
    puVar11 = src_y + 7;
    uVar12 = src_y[8];
    uVar13 = src_y[9];
    uVar14 = src_y[10];
    uVar15 = src_y[0xb];
    uVar16 = src_y[0xc];
    uVar17 = src_y[0xd];
    uVar18 = src_y[0xe];
    uVar19 = src_y[0xf];
    src_y = src_y + 0x10;
    auVar34._0_14_ = auVar40._0_14_;
    auVar34[0xe] = uVar35;
    auVar34[0xf] = *puVar11;
    auVar33._14_2_ = auVar34._14_2_;
    auVar33._0_13_ = auVar40._0_13_;
    auVar33[0xd] = *puVar10;
    auVar32._13_3_ = auVar33._13_3_;
    auVar32._0_12_ = auVar40._0_12_;
    auVar32[0xc] = (char)(uVar1 >> 0x18);
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._0_11_ = auVar40._0_11_;
    auVar31[0xb] = *puVar9;
    auVar30._11_5_ = auVar31._11_5_;
    auVar30._0_10_ = auVar40._0_10_;
    auVar30[10] = (char)((ulong)uVar2 >> 0x10);
    auVar29._10_6_ = auVar30._10_6_;
    auVar29._0_9_ = auVar40._0_9_;
    auVar29[9] = *puVar8;
    auVar28._9_7_ = auVar29._9_7_;
    auVar28._0_8_ = auVar40._0_8_;
    auVar28[8] = (char)(uVar1 >> 0x10);
    auVar27._8_8_ = auVar28._8_8_;
    auVar27[7] = *puVar7;
    auVar27[6] = (char)((ulong)uVar2 >> 8);
    auVar27[5] = *puVar6;
    auVar27[4] = (char)(uVar1 >> 8);
    auVar27[3] = *puVar5;
    auVar27[2] = (char)uVar2;
    auVar27[1] = uVar4;
    auVar27[0] = (char)uVar1;
    *(undefined1 (*) [16])dst_uyvy = auVar27;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0] = uVar48;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[1] = uVar12;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[2] = uVar36;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[3] = uVar13;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[4] = uVar49;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[5] = uVar14;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[6] = uVar37;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[7] = uVar15;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[8] = uVar50;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[9] = uVar16;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[10] = uVar38;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0xb] = uVar17;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0xc] = uVar51;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0xd] = uVar18;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0xe] = uVar39;
    (*(undefined1 (*) [16])((long)dst_uyvy + 0x10))[0xf] = uVar19;
    dst_uyvy = (uint8_t *)((long)dst_uyvy + 0x20);
    iVar26 = width + -0x10;
    bVar3 = 0xf < width;
    width = iVar26;
  } while (iVar26 != 0 && bVar3);
  return;
}

Assistant:

void I422ToUYVYRow_SSE2(const uint8_t* src_y,
                        const uint8_t* src_u,
                        const uint8_t* src_v,
                        uint8_t* dst_uyvy,
                        int width) {
  asm volatile(

      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movq        (%1),%%xmm2                   \n"
      "movq        0x00(%1,%2,1),%%xmm1          \n"
      "add         $0x8,%1                       \n"
      "punpcklbw   %%xmm1,%%xmm2                 \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm2,%%xmm1                 \n"
      "add         $0x10,%0                      \n"
      "punpcklbw   %%xmm0,%%xmm1                 \n"
      "punpckhbw   %%xmm0,%%xmm2                 \n"
      "movdqu      %%xmm1,(%3)                   \n"
      "movdqu      %%xmm2,0x10(%3)               \n"
      "lea         0x20(%3),%3                   \n"
      "sub         $0x10,%4                      \n"
      "jg          1b                            \n"
      : "+r"(src_y),     // %0
        "+r"(src_u),     // %1
        "+r"(src_v),     // %2
        "+r"(dst_uyvy),  // %3
        "+rm"(width)     // %4
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}